

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void anon_unknown.dwarf_2610::save_buffer_to_file(void *buffer,size_t buffer_size,char *filename)

{
  undefined8 uVar1;
  long local_220;
  ofstream output;
  char *filename_local;
  size_t buffer_size_local;
  void *buffer_local;
  
  if (filename == (char *)0x0) {
    __assert_fail("filename",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/samples/convert.cpp/main.cpp"
                  ,0x75,
                  "void (anonymous namespace)::save_buffer_to_file(const void *, const size_t, const char *)"
                 );
  }
  if (buffer != (void *)0x0) {
    if (buffer_size != 0) {
      std::ofstream::ofstream(&local_220,filename,_S_bin);
      uVar1 = *(undefined8 *)(local_220 + -0x18);
      std::operator|(_S_failbit,_S_badbit);
      std::ios::exceptions((int)&local_220 + (int)uVar1);
      std::ostream::write((char *)&local_220,(long)buffer);
      std::ofstream::close();
      std::ofstream::~ofstream(&local_220);
      return;
    }
    __assert_fail("buffer_size",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/samples/convert.cpp/main.cpp"
                  ,0x77,
                  "void (anonymous namespace)::save_buffer_to_file(const void *, const size_t, const char *)"
                 );
  }
  __assert_fail("buffer",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/samples/convert.cpp/main.cpp"
                ,0x76,
                "void (anonymous namespace)::save_buffer_to_file(const void *, const size_t, const char *)"
               );
}

Assistant:

void save_buffer_to_file(const void* buffer, const size_t buffer_size, const char* filename)
{
    assert(filename);
    assert(buffer);
    assert(buffer_size);

    std::ofstream output(filename, std::ios::binary);
    output.exceptions(std::ios::failbit | std::ios::badbit);

    output.write(static_cast<const char*>(buffer), static_cast<std::streamsize>(buffer_size));
    output.close(); // close explicitly to get feedback on failures.
}